

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O0

void Abc_SclUnmarkCriticalNodeWindow(SC_Man *p,Vec_Int_t *vPath)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vPath_local;
  SC_Man *p_local;
  
  for (local_24 = 0; iVar1 = Vec_IntSize(vPath), local_24 < iVar1; local_24 = local_24 + 1) {
    pNtk = p->pNtk;
    iVar1 = Vec_IntEntry(vPath,local_24);
    pAVar2 = Abc_NtkObj(pNtk,iVar1);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      *(uint *)&pAVar2->field_0x14 = *(uint *)&pAVar2->field_0x14 & 0xffffffef;
    }
  }
  return;
}

Assistant:

void Abc_SclUnmarkCriticalNodeWindow( SC_Man * p, Vec_Int_t * vPath )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObjVec( vPath, p->pNtk, pObj, i )
        pObj->fMarkA = 0;
}